

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O2

void __thiscall
chrono::utils::ChParserOpenSim::SetExcitationFunction
          (ChParserOpenSim *this,string *name,shared_ptr<chrono::ChFunction> *modulation)

{
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<chrono::ChLoadBase> force;
  shared_ptr<chrono::ChLoadBodyBodyTorque> bb_torque;
  shared_ptr<chrono::ChLoadBodyForce> b_force;
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_38;
  shared_ptr<chrono::ChLoadBase> local_28;
  
  Report::GetForce((Report *)local_68,(string *)this);
  if ((__buckets_ptr)local_68._0_8_ != (__buckets_ptr)0x0) {
    std::dynamic_pointer_cast<chrono::ChLoadBodyForce,chrono::ChLoadBase>(&local_28);
    if (local_28.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::dynamic_pointer_cast<chrono::ChLoadBodyBodyTorque,chrono::ChLoadBase>
                ((shared_ptr<chrono::ChLoadBase> *)&local_48);
      if (local_48._M_ptr != (element_type *)0x0) {
        std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x10)
                   ,&modulation->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)
        ;
        std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)
                   (local_48._M_ptr + 0x77),
                   (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x10)
                  );
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
      }
      p_Var1 = &local_48;
    }
    else {
      std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_38,
                 &modulation->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_28.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  [2].super_ChObj.m_name.field_2,&local_38);
      p_Var1 = &local_38;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.super___shared_ptr<chrono::ChLoadBase,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  return;
}

Assistant:

void ChParserOpenSim::SetExcitationFunction(const std::string& name, std::shared_ptr<ChFunction> modulation) {
    // Get the force element from the report object
    auto force = m_report.GetForce(name);
    if (!force)
        return;

    if (auto b_force = std::dynamic_pointer_cast<ChLoadBodyForce>(force)) {
        b_force->SetModulationFunction(modulation);
    } else if (auto bb_torque = std::dynamic_pointer_cast<ChLoadBodyBodyTorque>(force)) {
        bb_torque->SetModulationFunction(modulation);
    }
}